

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * lua_setlocal(lua_State *L,lua_Debug *ar,int n)

{
  StkId pTVar1;
  int iVar2;
  undefined4 uVar3;
  char *pcVar4;
  StkId pos;
  StkId local_28;
  
  local_28 = (StkId)0x0;
  swapextra(L);
  pcVar4 = findlocal(L,ar->i_ci,n,&local_28);
  if (pcVar4 != (char *)0x0) {
    pTVar1 = L->top;
    iVar2 = pTVar1[-1].tt_;
    uVar3 = *(undefined4 *)&pTVar1[-1].field_0xc;
    local_28->value_ = pTVar1[-1].value_;
    local_28->tt_ = iVar2;
    *(undefined4 *)&local_28->field_0xc = uVar3;
    L->top = L->top + -1;
  }
  swapextra(L);
  return pcVar4;
}

Assistant:

LUA_API const char *lua_setlocal (lua_State *L, const lua_Debug *ar, int n) {
  StkId pos = NULL;  /* to avoid warnings */
  const char *name;
  lua_lock(L);
  swapextra(L);
  name = findlocal(L, ar->i_ci, n, &pos);
  if (name) {
    setobjs2s(L, pos, L->top - 1);
    L->top--;  /* pop value */
  }
  swapextra(L);
  lua_unlock(L);
  return name;
}